

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O2

string * __thiscall
JointActionDiscrete::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,JointActionDiscrete *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  stringstream ss;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  ppAVar1 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar2 = (this->_m_apVector).
                 super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar2 != ppAVar1;
      ppAVar2 = ppAVar2 + 1) {
    if (*ppAVar2 != (ActionDiscrete *)0x0) {
      (*((*ppAVar2)->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity[3])
                (local_1d8);
      std::operator<<(local_1a8,local_1d8);
      std::__cxx11::string::~string(local_1d8);
    }
    if (ppAVar2 != ppAVar1 + -1) {
      std::operator<<(local_1a8,"_");
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string JointActionDiscrete::SoftPrintBrief() const
{
    stringstream ss;
    vector<const ActionDiscrete*>::const_iterator it =  _m_apVector.begin();
    vector<const ActionDiscrete*>::const_iterator last =  _m_apVector.end();
    
    while(it != last)
    {
        if(*it != 0)
            ss << (*it)->SoftPrintBrief();
        if(it != last-1)
            ss << "_";
        it++;
    }
    return(ss.str());
}